

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O2

float Mio_GateReadPinDelay(Mio_Gate_t *pGate,int iPin)

{
  Mio_Pin_t *pMVar1;
  Mio_Pin_t **ppMVar2;
  bool bVar3;
  
  ppMVar2 = &pGate->pPins;
  while( true ) {
    pMVar1 = *ppMVar2;
    if (pMVar1 == (Mio_Pin_t *)0x0) {
      return 1e+09;
    }
    bVar3 = iPin == 0;
    iPin = iPin + -1;
    if (bVar3) break;
    ppMVar2 = &pMVar1->pNext;
  }
  return (float)(pMVar1->dDelayBlockRise * 0.5 + pMVar1->dDelayBlockFall * 0.5);
}

Assistant:

float Mio_GateReadPinDelay( Mio_Gate_t * pGate, int iPin )
{
    Mio_Pin_t * pPin;
    int i = 0;
    Mio_GateForEachPin( pGate, pPin )
        if ( i++ == iPin )
            return 0.5 * pPin->dDelayBlockRise + 0.5 * pPin->dDelayBlockFall;
    return ABC_INFINITY;
}